

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

void __thiscall nuraft::buffer::put(buffer *this,int32 val)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *this_00;
  byte *pbVar3;
  int in_ESI;
  buffer *in_RDI;
  size_t i;
  byte *d;
  ulong local_30;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < 4) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer to store int32");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar3 = data(in_RDI);
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    pbVar3[local_30] = (byte)(in_ESI >> ((byte)(local_30 << 3) & 0x1f));
  }
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + 4;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 4;
  }
  return;
}

Assistant:

void buffer::put(int32 val) {
    if (size() - pos() < sz_int) {
        throw std::overflow_error("insufficient buffer to store int32");
    }

    byte* d = data();
    for (size_t i = 0; i < sz_int; ++i) {
        *(d + i) = (byte)(val >> (i * 8));
    }

    __mv_fw_block(this, sz_int);
}